

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::operator()(CppGenerator *this)

{
  Grammar **this_00;
  QList<int> *this_01;
  QList<int> *this_02;
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  Grammar *pGVar4;
  QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
  *pQVar5;
  _Base_ptr p_Var6;
  Recognizer *pRVar7;
  FILE *pFVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int *table;
  int *table_00;
  QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>
  *pQVar13;
  const_iterator cVar14;
  int *piVar15;
  _Rb_tree_node_base *p_Var16;
  const_iterator cVar17;
  _Base_ptr p_Var18;
  QTextStream *pQVar19;
  StateList *pSVar20;
  pointer piVar21;
  pointer piVar22;
  long *plVar23;
  int iVar24;
  int iVar25;
  _Base_ptr *pp_Var26;
  _List_node_base *p_Var27;
  char16_t *pcVar28;
  qsizetype extraout_RDX;
  qsizetype i;
  char *pcVar29;
  StatePointer state;
  size_t sVar30;
  Automaton *pAVar31;
  long lVar32;
  _List_node_base *p_Var33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  char16_t *pcVar37;
  int iVar38;
  long lVar39;
  long in_FS_OFFSET;
  R RVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  NameSet lookaheads;
  int local_194;
  QString local_158;
  undefined1 *local_138;
  undefined1 *puStack_130;
  QString local_128;
  undefined1 *local_108;
  undefined1 *puStack_100;
  QString local_f8;
  QString local_d8;
  QString local_b8;
  undefined1 local_98 [8];
  char *pcStack_90;
  _Link_type local_88;
  _Base_ptr p_Stack_80;
  _Base_ptr local_78;
  size_t sStack_70;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar31 = this->aut;
  iVar36 = (int)(pAVar31->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
                _M_size;
  this->state_count = iVar36;
  this_00 = &this->grammar;
  iVar24 = (int)(this->grammar->terminals)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->terminal_count = iVar24;
  iVar38 = (int)(this->grammar->non_terminals)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->non_terminal_count = iVar38;
  iVar24 = iVar24 * iVar36;
  sVar1 = (long)iVar24 * 4;
  sVar30 = sVar1;
  if (iVar24 < 0) {
    sVar30 = 0xffffffffffffffff;
  }
  table = (int *)operator_new__(sVar30);
  local_194 = 0;
  memset(table,0,sVar1);
  iVar38 = iVar38 * iVar36;
  sVar1 = (long)iVar38 * 4;
  uVar35 = 0xffffffffffffffff;
  if (-1 < iVar38) {
    uVar35 = sVar1;
  }
  table_00 = (int *)operator_new__(uVar35);
  memset(table_00,0,sVar1);
  this->accept_state = -1;
  state._M_node =
       (pAVar31->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
       super__List_node_base._M_next;
  pAVar31 = this->aut;
  iVar36 = 0;
  if (state._M_node != (_List_node_base *)&pAVar31->states) {
    iVar36 = 0;
    local_194 = 0;
    do {
      iVar24 = Automaton::id(pAVar31,state);
      p_Var27 = state._M_node + 4;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)p_Var27);
      p_Var16 = (_Rb_tree_node_base *)state._M_node[4]._M_next[2]._M_next;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)p_Var27);
      pQVar13 = (QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>
                 *)state._M_node[4]._M_next;
      while ((_Rb_tree_header *)p_Var16 != &(pQVar13->m)._M_t._M_impl.super__Rb_tree_header) {
        iVar38 = Automaton::id(this->aut,*(_List_node_base **)(p_Var16 + 1));
        iVar10 = Automaton::id(this->aut,(_List_node_base *)p_Var16[1]._M_parent);
        pGVar4 = this->grammar;
        local_68 = *(undefined1 (*) [8])(p_Var16 + 1);
        cVar14 = std::
                 _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 ::find(&(pGVar4->non_terminals)._M_t,(key_type *)local_68);
        if ((_Rb_tree_header *)cVar14._M_node ==
            &(pGVar4->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
          iVar38 = iVar38 + this->terminal_count * iVar24;
          piVar15 = table;
        }
        else {
          iVar38 = (iVar38 - this->terminal_count) + this->non_terminal_count * iVar24;
          piVar15 = table_00;
        }
        piVar15[iVar38] = iVar10;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                  ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)p_Var27);
        pQVar13 = (((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                     *)&p_Var27->_M_next)->d).ptr;
      }
      for (local_b8.d.d = (Data *)state._M_node[2]._M_prev;
          local_b8.d.d != (Data *)&state._M_node[2]._M_prev;
          local_b8.d.d = *(Data **)&((local_b8.d.d)->super_QArrayData).ref_) {
        if ((_List_node_base *)(&(local_b8.d.d)->super_QArrayData)[1].alloc ==
            (_List_node_base *)
            &(*(_List_node_base **)(&(local_b8.d.d)->super_QArrayData + 1))[1]._M_prev) {
          iVar38 = Automaton::id(this->aut,
                                 *(_List_node_base **)(&(local_b8.d.d)->super_QArrayData + 1));
          _Stack_60._M_right = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          _Stack_60._M_parent = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          _Stack_60._M_left = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          _Stack_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = (_Link_type)0x0;
          local_98 = (undefined1  [8])0x0;
          pcStack_90 = (char *)0x0;
          p_Stack_80 = (_Base_ptr)&pcStack_90;
          sStack_70 = 0;
          local_78 = p_Stack_80;
          QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
          ::value((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                   *)local_68,&this->aut->lookaheads,(_List_iterator<Item> *)&local_b8,
                  (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                   *)local_98);
          std::
          _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          ::_M_erase((_Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                      *)local_98,local_88);
          if (*(_List_node_base **)&local_b8.d.d[1].super_QArrayData ==
              (this->grammar->goal)._M_node) {
            this->accept_state = iVar24;
          }
          if (_Stack_60._M_left != &_Stack_60) {
            iVar10 = -iVar38;
            p_Var18 = _Stack_60._M_left;
            do {
              p_Var16 = p_Var18 + 1;
              iVar12 = this->terminal_count;
              iVar11 = Automaton::id(this->aut,*(_List_node_base **)(p_Var18 + 1));
              iVar11 = iVar11 + iVar12 * iVar24;
              if (table[iVar11] == 0) {
                table[iVar11] = iVar10;
              }
              else if (table[iVar11] < 0) {
                if (this->verbose == true) {
                  pQVar19 = qout();
                  pQVar19 = (QTextStream *)
                            QTextStream::operator<<
                                      (pQVar19,
                                       "*** Warning. Found a reduce/reduce conflict in state ");
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,iVar24);
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19," on token ``");
                  pQVar19 = operator<<(pQVar19,(Name *)p_Var16);
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"\'\' between rule ");
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,iVar38);
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19," and ");
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,-table[iVar11]);
                  Qt::endl(pQVar19);
                }
                local_194 = local_194 + 1;
                iVar12 = table[iVar11];
                if (table[iVar11] <= iVar10) {
                  iVar12 = iVar10;
                }
                table[iVar11] = iVar12;
                if (this->verbose == true) {
                  pQVar19 = qout();
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"\tresolved using rule ")
                  ;
                  iVar12 = -table[iVar11];
LAB_001067c4:
                  pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,iVar12);
                  Qt::endl(pQVar19);
                }
              }
              else {
                pGVar4 = *this_00;
                if ((((list<QString,_std::allocator<QString>_> *)
                      *(undefined1 **)(*(long *)&local_b8.d.d[1].super_QArrayData + 0x30) ==
                      &pGVar4->names) ||
                    (pQVar5 = (pGVar4->token_info).d.d.ptr,
                    pQVar5 == (QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
                               *)0x0)) ||
                   (cVar17 = std::
                             _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>
                             ::find(&(pQVar5->m)._M_t,(key_type *)p_Var16),
                   cVar17._M_node ==
                   &(((pGVar4->token_info).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header
                   )) {
                  iVar36 = iVar36 + 1;
                  if (this->verbose == true) {
                    pQVar19 = qout();
                    pQVar19 = (QTextStream *)
                              QTextStream::operator<<
                                        (pQVar19,
                                         "*** Warning. Found a shift/reduce conflict in state ");
                    pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,iVar24);
                    pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19," on token ``");
                    pQVar19 = operator<<(pQVar19,(Name *)p_Var16);
                    pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"\'\' with rule ");
                    iVar12 = iVar38;
                    goto LAB_001067c4;
                  }
                }
                else {
                  pGVar4 = *this_00;
                  local_98 = (undefined1  [8])0x0;
                  pQVar5 = (pGVar4->token_info).d.d.ptr;
                  pp_Var26 = (_Base_ptr *)local_98;
                  if (pQVar5 != (QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
                                 *)0x0) {
                    cVar17 = std::
                             _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>
                             ::find(&(pQVar5->m)._M_t,
                                    (key_type *)(*(long *)&local_b8.d.d[1].super_QArrayData + 0x30))
                    ;
                    pp_Var26 = &cVar17._M_node[1]._M_parent;
                    if (cVar17._M_node ==
                        &(((pGVar4->token_info).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                         _M_header) {
                      pp_Var26 = (_Base_ptr *)local_98;
                    }
                  }
                  p_Var6 = *pp_Var26;
                  pGVar4 = *this_00;
                  local_98 = (undefined1  [8])0x0;
                  pQVar5 = (pGVar4->token_info).d.d.ptr;
                  pp_Var26 = (_Base_ptr *)local_98;
                  if (pQVar5 != (QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
                                 *)0x0) {
                    cVar17 = std::
                             _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>
                             ::find(&(pQVar5->m)._M_t,(key_type *)p_Var16);
                    pp_Var26 = &cVar17._M_node[1]._M_parent;
                    if (cVar17._M_node ==
                        &(((pGVar4->token_info).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                         _M_header) {
                      pp_Var26 = (_Base_ptr *)local_98;
                    }
                  }
                  iVar12 = (int)((ulong)p_Var6 >> 0x20);
                  iVar25 = (int)((ulong)*pp_Var26 >> 0x20);
                  if (iVar25 < iVar12) {
LAB_0010668c:
                    table[iVar11] = iVar10;
                  }
                  else if (iVar12 == iVar25) {
                    iVar12 = (int)p_Var6;
                    if (iVar12 == 0) {
                      table[iVar11] = 0;
                    }
                    else if (iVar12 == 1) goto LAB_0010668c;
                  }
                }
              }
              p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
            } while (p_Var18 != &_Stack_60);
          }
          std::
          _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          ::_M_erase((_Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                      *)local_68,(_Link_type)_Stack_60._M_parent);
        }
      }
      state._M_node = (state._M_node)->_M_next;
      pAVar31 = this->aut;
    } while (state._M_node != (_List_node_base *)&pAVar31->states);
  }
  if (iVar36 != 0 || local_194 != 0) {
    if ((iVar36 != (*this_00)->expected_shift_reduce) ||
       (local_194 != (*this_00)->expected_reduce_reduce)) {
      pQVar19 = qerr();
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"*** Conflicts: ");
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,iVar36);
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19," shift/reduce, ");
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,local_194);
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19," reduce/reduce");
      Qt::endl(pQVar19);
      if (this->warnings_are_errors == true) {
LAB_00107d8f:
        pQVar19 = qerr();
        pQVar19 = (QTextStream *)
                  QTextStream::operator<<
                            (pQVar19,
                             "qlalr: error: warning occurred, treating as error due to --exit-on-warn."
                            );
        Qt::endl(pQVar19);
        exit(2);
      }
    }
    if (this->verbose == true) {
      pQVar19 = qout();
      pQVar19 = (QTextStream *)Qt::endl(pQVar19);
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"*** Conflicts: ");
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,iVar36);
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19," shift/reduce, ");
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,local_194);
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19," reduce/reduce");
      pQVar19 = (QTextStream *)Qt::endl(pQVar19);
      Qt::endl(pQVar19);
    }
  }
  local_88 = (_Link_type)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  pcStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  iVar36 = 0;
  QBitArray::QBitArray
            ((QBitArray *)local_98,
             (long)(int)(this->grammar->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl
                        ._M_node._M_size,false);
  p_Var27 = (this->aut->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var27 != (_List_node_base *)&this->aut->states) {
    i = extraout_RDX;
    do {
      iVar24 = this->terminal_count;
      if (0 < iVar24) {
        lVar39 = 0;
        do {
          if (table[iVar24 * iVar36 + lVar39] < 0) {
            RVar40 = QBitArray::bitLocation<QBitArray>
                               ((QBitArray *)local_98,
                                (QBitArray *)(ulong)(uint)~table[iVar24 * iVar36 + lVar39],i);
            i = RVar40._8_8_;
            *RVar40.byte = *RVar40.byte | RVar40.bitMask;
          }
          iVar24 = this->terminal_count;
          lVar39 = lVar39 + 1;
        } while ((int)lVar39 < iVar24);
      }
      iVar36 = iVar36 + 1;
      p_Var27 = p_Var27->_M_next;
    } while (p_Var27 != (_List_node_base *)&this->aut->states);
  }
  pcVar29 = pcStack_90;
  if (pcStack_90 == (char *)0x0) {
    pcVar29 = (char *)&QByteArray::_empty;
  }
  if ((long)local_88 * 8 != (long)*pcVar29 && -1 < (long)local_88 * 8 - (long)*pcVar29) {
    p_Var27 = ((*this_00)->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
              super__List_node_base._M_next;
    uVar35 = 0;
    do {
      if ((((byte)pcStack_90[(uVar35 >> 3) + 1] >> ((uint)uVar35 & 7) & 1) == 0) &&
         (p_Var27 != ((*this_00)->goal)._M_node)) {
        pQVar19 = qerr();
        pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"*** Warning: Rule ``");
        pQVar19 = operator<<(pQVar19,(Rule *)(p_Var27 + 1));
        pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"\'\' is useless!");
        Qt::endl(pQVar19);
        if (this->warnings_are_errors == true) goto LAB_00107d8f;
      }
      pcVar29 = pcStack_90;
      if (pcStack_90 == (char *)0x0) {
        pcVar29 = (char *)&QByteArray::_empty;
      }
      uVar35 = uVar35 + 1;
      p_Var27 = p_Var27->_M_next;
    } while ((long)uVar35 < (long)local_88 * 8 - (long)*pcVar29);
  }
  p_Var27 = (this->aut->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  pSVar20 = &this->aut->states;
  if (p_Var27 != (_List_node_base *)pSVar20) {
    uVar2 = this->terminal_count;
    pGVar4 = this->grammar;
    lVar39 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar32 = lVar39 * (ulong)uVar2;
        uVar35 = 0;
        do {
          uVar3 = table[lVar32 + uVar35];
          if ((int)uVar3 < 0) {
            p_Var33 = (pGVar4->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
                      super__List_node_base._M_next;
            if (uVar3 != 0xffffffff) {
              uVar34 = (ulong)~uVar3;
              do {
                p_Var33 = p_Var33->_M_next;
                uVar34 = uVar34 - 1;
              } while (uVar34 != 0);
            }
            if (p_Var27[5]._M_prev == p_Var33) {
              table[lVar32 + uVar35] = 0;
            }
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar2);
      }
      lVar39 = lVar39 + 1;
      p_Var27 = p_Var27->_M_next;
    } while (p_Var27 != (_List_node_base *)pSVar20);
  }
  this_01 = &this->defgoto;
  QList<int>::resize(this_01,(long)this->non_terminal_count);
  if (0 < this->non_terminal_count) {
    this_02 = &this->count;
    lVar39 = 0;
    do {
      QList<int>::fill(this_02,0,(long)this->state_count);
      piVar21 = QList<int>::data(this_01);
      if (0 < this->state_count) {
        iVar36 = 0;
        do {
          iVar24 = table_00[this->non_terminal_count * iVar36 + (int)lVar39];
          lVar32 = (long)iVar24;
          if (lVar32 != 0) {
            piVar22 = QList<int>::data(this_02);
            piVar22[lVar32] = piVar22[lVar32] + 1;
            piVar22 = QList<int>::data(this_02);
            iVar38 = piVar22[lVar32];
            iVar10 = piVar21[lVar39];
            piVar22 = QList<int>::data(this_02);
            if (piVar22[iVar10] < iVar38) {
              piVar21[lVar39] = iVar24;
            }
          }
          iVar36 = iVar36 + 1;
        } while (iVar36 < this->state_count);
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 < this->non_terminal_count);
  }
  iVar36 = this->state_count;
  if (0 < iVar36) {
    iVar24 = 0;
    do {
      uVar35 = (ulong)(uint)this->non_terminal_count;
      if (0 < this->non_terminal_count) {
        lVar39 = 0;
        do {
          lVar32 = (int)uVar35 * iVar24 + lVar39;
          iVar36 = table_00[lVar32];
          piVar21 = QList<int>::data(this_01);
          if (iVar36 == piVar21[lVar39]) {
            table_00[lVar32] = 0;
          }
          lVar39 = lVar39 + 1;
          uVar35 = (ulong)this->non_terminal_count;
        } while (lVar39 < (long)uVar35);
      }
      iVar24 = iVar24 + 1;
      iVar36 = this->state_count;
    } while (iVar24 < iVar36);
  }
  Compress::operator()(&this->compressed_action,table,iVar36,this->terminal_count);
  Compress::operator()(&this->compressed_goto,table_00,this->state_count,this->non_terminal_count);
  operator_delete__(table);
  operator_delete__(table_00);
  if ((this->grammar->merged_output).d.size != 0) {
    local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_f8,&this->grammar->merged_output);
    cVar9 = QFile::open((QFile *)&local_f8,2);
    if (cVar9 == '\0') {
      operator()((CppGenerator *)this_00);
    }
    else {
      local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_128,(QIODevice *)&local_f8);
      if (this->copyright == true) {
        QVar41.m_data = (storage_type *)0x9d;
        QVar41.m_size = (qsizetype)local_68;
        QString::fromLatin1(QVar41);
        local_b8.d.d = (Data *)local_68;
        local_b8.d.ptr = (char16_t *)_Stack_60._0_8_;
        local_b8.d.size = (qsizetype)_Stack_60._M_parent;
        pQVar19 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_128,&local_b8);
        QVar42.m_data = (storage_type *)0xfa;
        QVar42.m_size = (qsizetype)local_68;
        QString::fromLatin1(QVar42);
        local_d8.d.d = (Data *)local_68;
        local_d8.d.ptr = (char16_t *)_Stack_60._0_8_;
        local_d8.d.size = (qsizetype)_Stack_60._M_parent;
        pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,&local_d8);
        Qt::endl(pQVar19);
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QTextStream::operator<<
                ((QTextStream *)&local_128,"// This file was generated by qlalr - DO NOT EDIT!\n");
      startIncludeGuard((QString *)local_68,&(*this_00)->merged_output);
      pQVar19 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      Qt::endl(pQVar19);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      if (this->copyright == true) {
        pQVar19 = (QTextStream *)
                  QTextStream::operator<<((QTextStream *)&local_128,"#if defined(ERROR)");
        pQVar19 = (QTextStream *)Qt::endl(pQVar19);
        pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"#  undef ERROR");
        pQVar19 = (QTextStream *)Qt::endl(pQVar19);
        pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"#endif");
        pQVar19 = (QTextStream *)Qt::endl(pQVar19);
        Qt::endl(pQVar19);
      }
      generateDecl(this,(QTextStream *)&local_128);
      generateImpl(this,(QTextStream *)&local_128);
      pRVar7 = this->p;
      local_68 = (undefined1  [8])(pRVar7->_M_decls).d.d;
      _Stack_60._0_8_ = (pRVar7->_M_decls).d.ptr;
      _Stack_60._M_parent = (_Base_ptr)(pRVar7->_M_decls).d.size;
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      pRVar7 = this->p;
      local_68 = (undefined1  [8])(pRVar7->_M_impls).d.d;
      _Stack_60._0_8_ = (pRVar7->_M_impls).d.ptr;
      _Stack_60._M_parent = (_Base_ptr)(pRVar7->_M_impls).d.size;
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      Qt::endl((QTextStream *)&local_128);
      endIncludeGuard((QString *)local_68,&(*this_00)->merged_output);
      pQVar19 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      Qt::endl(pQVar19);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      QTextStream::~QTextStream((QTextStream *)&local_128);
    }
    QFile::~QFile((QFile *)&local_f8);
    goto LAB_0010704c;
  }
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper(&local_d8);
  _Stack_60._M_parent = (_Base_ptr)local_d8.d.size;
  _Stack_60._0_8_ = local_d8.d.ptr;
  local_68 = (undefined1  [8])local_d8.d.d;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  _Stack_60._M_left = (_Base_ptr)0x4;
  _Stack_60._M_right = (_Base_ptr)0x1183e0;
  QStringBuilder<QString,_QLatin1String>::convertTo<QString>
            (&local_b8,(QStringBuilder<QString,_QLatin1String> *)local_68);
  if (local_68 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper(&local_f8);
  _Stack_60._M_parent = (_Base_ptr)local_f8.d.size;
  _Stack_60._0_8_ = local_f8.d.ptr;
  local_68 = (undefined1  [8])local_f8.d.d;
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  _Stack_60._M_left = (_Rb_tree_node_base *)0x4;
  _Stack_60._M_right = (_Base_ptr)0x1183e5;
  QStringBuilder<QString,_QLatin1String>::convertTo<QString>
            (&local_d8,(QStringBuilder<QString,_QLatin1String> *)local_68);
  if (local_68 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_108,&local_b8);
  cVar9 = QFile::open((QFile *)&local_108,2);
  pFVar8 = _stderr;
  if (cVar9 == '\0') {
    QString::toLocal8Bit_helper((QChar *)local_68,(longlong)local_b8.d.ptr);
    pcVar37 = (char16_t *)_Stack_60._0_8_;
    if ((char16_t *)_Stack_60._0_8_ == (char16_t *)0x0) {
      pcVar37 = (char16_t *)&QByteArray::_empty;
    }
    QIODevice::errorString();
    QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_128.d.ptr);
    pcVar28 = local_f8.d.ptr;
    if (local_f8.d.ptr == (char16_t *)0x0) {
      pcVar28 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(pFVar8,"*** cannot create %s: %s\n",pcVar37,pcVar28);
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_68 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68,1,0x10);
      }
    }
  }
  else {
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_138,(QIODevice *)&local_108);
    local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::toUpper_helper((QString *)local_68);
    plVar23 = (long *)QString::replace((QChar)(char16_t)(QString *)local_68,(QChar)0x2e,0x5f);
    local_f8.d.d = (Data *)*plVar23;
    local_f8.d.ptr = (char16_t *)plVar23[1];
    local_f8.d.size = plVar23[2];
    if ((QArrayData *)local_f8.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_f8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_f8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_68 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68,2,0x10);
      }
    }
    if (this->copyright == true) {
      QVar43.m_data = (storage_type *)0x9d;
      QVar43.m_size = (qsizetype)local_68;
      QString::fromLatin1(QVar43);
      local_128.d.d = (Data *)local_68;
      local_128.d.ptr = (char16_t *)_Stack_60._0_8_;
      local_128.d.size = (qsizetype)_Stack_60._M_parent;
      pQVar19 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,&local_128);
      QVar44.m_data = (storage_type *)0xfa;
      QVar44.m_size = (qsizetype)local_68;
      QString::fromLatin1(QVar44);
      local_158.d.d = (Data *)local_68;
      local_158.d.ptr = (char16_t *)_Stack_60._0_8_;
      local_158.d.size = (qsizetype)_Stack_60._M_parent;
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,&local_158);
      Qt::endl(pQVar19);
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QTextStream::operator<<
              ((QTextStream *)&local_138,"// This file was generated by qlalr - DO NOT EDIT!\n");
    pQVar19 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"#ifndef ");
    pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,&local_f8);
    pQVar19 = (QTextStream *)Qt::endl(pQVar19);
    pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"#define ");
    pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,&local_f8);
    pQVar19 = (QTextStream *)Qt::endl(pQVar19);
    Qt::endl(pQVar19);
    if (this->copyright == true) {
      pQVar19 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_138,"#include <QtCore/qglobal.h>");
      pQVar19 = (QTextStream *)Qt::endl(pQVar19);
      Qt::endl(pQVar19);
      pQVar19 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_138,"QT_BEGIN_NAMESPACE");
      pQVar19 = (QTextStream *)Qt::endl(pQVar19);
      Qt::endl(pQVar19);
    }
    generateDecl(this,(QTextStream *)&local_138);
    if (this->copyright == true) {
      pQVar19 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"QT_END_NAMESPACE")
      ;
      Qt::endl(pQVar19);
    }
    pQVar19 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"#endif // ");
    pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,&local_f8);
    pQVar19 = (QTextStream *)Qt::endl(pQVar19);
    Qt::endl(pQVar19);
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QTextStream::~QTextStream((QTextStream *)&local_138);
  }
  QFile::~QFile((QFile *)&local_108);
  if (cVar9 != '\0') {
    local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_158,&local_d8);
    cVar9 = QFile::open((QFile *)&local_158,2);
    pFVar8 = _stderr;
    if (cVar9 == '\0') {
      QString::toLocal8Bit_helper((QChar *)local_68,(longlong)local_d8.d.ptr);
      pcVar37 = (char16_t *)_Stack_60._0_8_;
      if ((char16_t *)_Stack_60._0_8_ == (char16_t *)0x0) {
        pcVar37 = (char16_t *)&QByteArray::_empty;
      }
      QIODevice::errorString();
      QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_128.d.ptr);
      pcVar28 = local_f8.d.ptr;
      if (local_f8.d.ptr == (char16_t *)0x0) {
        pcVar28 = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar8,"*** cannot create %s: %s\n",pcVar37,pcVar28);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,1,0x10);
        }
      }
    }
    else {
      local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_128,(QIODevice *)&local_158);
      if (this->copyright == true) {
        QVar45.m_data = (storage_type *)0x9d;
        QVar45.m_size = (qsizetype)local_68;
        QString::fromLatin1(QVar45);
        local_f8.d.d = (Data *)local_68;
        local_f8.d.ptr = (char16_t *)_Stack_60._0_8_;
        local_f8.d.size = (qsizetype)_Stack_60._M_parent;
        QTextStream::operator<<((QTextStream *)&local_128,&local_f8);
        if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QTextStream::operator<<
                ((QTextStream *)&local_128,"// This file was generated by qlalr - DO NOT EDIT!\n");
      pQVar19 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_128,"#include \"");
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,&local_b8);
      pQVar19 = (QTextStream *)QTextStream::operator<<(pQVar19,"\"");
      pQVar19 = (QTextStream *)Qt::endl(pQVar19);
      Qt::endl(pQVar19);
      if (this->copyright == true) {
        pQVar19 = (QTextStream *)
                  QTextStream::operator<<((QTextStream *)&local_128,"QT_BEGIN_NAMESPACE");
        pQVar19 = (QTextStream *)Qt::endl(pQVar19);
        Qt::endl(pQVar19);
      }
      generateImpl(this,(QTextStream *)&local_128);
      if (this->copyright == true) {
        pQVar19 = (QTextStream *)
                  QTextStream::operator<<((QTextStream *)&local_128,"QT_END_NAMESPACE");
        Qt::endl(pQVar19);
      }
      QTextStream::~QTextStream((QTextStream *)&local_128);
    }
    QFile::~QFile((QFile *)&local_158);
    if (cVar9 != '\0') {
      if (((*this_00)->decl_file_name).d.size != 0) {
        local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_158,&(*this_00)->decl_file_name);
        cVar9 = QFile::open((QFile *)&local_158,2);
        pFVar8 = _stderr;
        if (cVar9 == '\0') {
          QString::toLocal8Bit_helper
                    ((QChar *)local_68,(longlong)((*this_00)->decl_file_name).d.ptr);
          pcVar37 = (char16_t *)_Stack_60._0_8_;
          if ((char16_t *)_Stack_60._0_8_ == (char16_t *)0x0) {
            pcVar37 = (char16_t *)&QByteArray::_empty;
          }
          QIODevice::errorString();
          QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_128.d.ptr);
          pcVar28 = local_f8.d.ptr;
          if (local_f8.d.ptr == (char16_t *)0x0) {
            pcVar28 = (char16_t *)&QByteArray::_empty;
          }
          fprintf(pFVar8,"*** cannot create %s: %s\n",pcVar37,pcVar28);
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_68 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_68,1,0x10);
            }
          }
        }
        else {
          local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)&local_158);
          pRVar7 = this->p;
          local_68 = (undefined1  [8])(pRVar7->_M_decls).d.d;
          _Stack_60._0_8_ = (pRVar7->_M_decls).d.ptr;
          _Stack_60._M_parent = (_Base_ptr)(pRVar7->_M_decls).d.size;
          if (local_68 != (undefined1  [8])0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QTextStream::operator<<((QTextStream *)&local_f8,(QString *)local_68);
          if (local_68 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_68,2,0x10);
            }
          }
          QTextStream::~QTextStream((QTextStream *)&local_f8);
        }
        QFile::~QFile((QFile *)&local_158);
        if (cVar9 == '\0') goto LAB_001078da;
      }
      if (((*this_00)->impl_file_name).d.size != 0) {
        local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_158,&(*this_00)->impl_file_name);
        cVar9 = QFile::open((QFile *)&local_158,2);
        pFVar8 = _stderr;
        if (cVar9 == '\0') {
          QString::toLocal8Bit_helper
                    ((QChar *)local_68,(longlong)((*this_00)->impl_file_name).d.ptr);
          pcVar37 = (char16_t *)_Stack_60._0_8_;
          if ((char16_t *)_Stack_60._0_8_ == (char16_t *)0x0) {
            pcVar37 = (char16_t *)&QByteArray::_empty;
          }
          QIODevice::errorString();
          QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_128.d.ptr);
          pcVar28 = local_f8.d.ptr;
          if (local_f8.d.ptr == (char16_t *)0x0) {
            pcVar28 = (char16_t *)&QByteArray::_empty;
          }
          fprintf(pFVar8,"*** cannot create %s: %s\n",pcVar37,pcVar28);
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_68 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_68,1,0x10);
            }
          }
        }
        else {
          local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)&local_158);
          pRVar7 = this->p;
          local_68 = (undefined1  [8])(pRVar7->_M_impls).d.d;
          _Stack_60._0_8_ = (pRVar7->_M_impls).d.ptr;
          _Stack_60._M_parent = (_Base_ptr)(pRVar7->_M_impls).d.size;
          if (local_68 != (undefined1  [8])0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QTextStream::operator<<((QTextStream *)&local_f8,(QString *)local_68);
          if (local_68 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_68,2,0x10);
            }
          }
          QTextStream::~QTextStream((QTextStream *)&local_f8);
        }
        QFile::~QFile((QFile *)&local_158);
      }
    }
  }
LAB_001078da:
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0010704c:
  if (local_98 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CppGenerator::operator () ()
{
  // action table...
  state_count = static_cast<int>(aut.states.size());
  terminal_count = static_cast<int>(grammar.terminals.size());
  non_terminal_count = static_cast<int>(grammar.non_terminals.size());

#define ACTION(i, j) table [(i) * terminal_count + (j)]
#define GOTO(i, j) pgoto [(i) * non_terminal_count + (j)]

  int *table = new int [state_count * terminal_count];
  ::memset (table, 0, state_count * terminal_count * sizeof (int));

  int *pgoto = new int [state_count * non_terminal_count];
  ::memset (pgoto, 0, state_count * non_terminal_count * sizeof (int));

  accept_state = -1;
  int shift_reduce_conflict_count = 0;
  int reduce_reduce_conflict_count = 0;

  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state)
    {
      int q = aut.id (state);

      for (Bundle::iterator a = state->bundle.begin (); a != state->bundle.end (); ++a)
        {
          int symbol = aut.id (a.key ());
          int r = aut.id (a.value ());

          Q_ASSERT (r < state_count);

          if (grammar.isNonTerminal (a.key ()))
            {
              Q_ASSERT(symbol >= terminal_count && symbol < static_cast<int>(grammar.names.size()));
              GOTO (q, symbol - terminal_count) = r;
            }

          else
            ACTION (q, symbol) = r;
        }

      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs ())
            continue;

          int r = aut.id (item->rule);

          const NameSet lookaheads = aut.lookaheads.value (item);

          if (item->rule == grammar.goal)
            accept_state = q;

          for (const Name &s : lookaheads)
            {
              int &u = ACTION (q, aut.id (s));

              if (u == 0)
                u = - r;

              else if (u < 0)
                {
                  if (verbose)
                    qout() << "*** Warning. Found a reduce/reduce conflict in state " << q << " on token ``" << s << "'' between rule "
                         << r << " and " << -u << Qt::endl;

                  ++reduce_reduce_conflict_count;

                  u = qMax (u, -r);

                  if (verbose)
                    qout() << "\tresolved using rule " << -u << Qt::endl;
                }

              else if (u > 0)
                {
                  if (item->rule->prec != grammar.names.end() && grammar.token_info.contains (s))
                    {
                      Grammar::TokenInfo info_r = grammar.token_info.value (item->rule->prec);
                      Grammar::TokenInfo info_s = grammar.token_info.value (s);

                      if (info_r.prec > info_s.prec)
                        u = -r;
                      else if (info_r.prec == info_s.prec)
                        {
                          switch (info_r.assoc) {
                          case Grammar::Left:
                            u = -r;
                            break;
                          case Grammar::Right:
                            // shift... nothing to do
                            break;
                          case Grammar::NonAssoc:
                            u = 0;
                            break;
                          } // switch
                        }
                    }

                  else
                    {
                      ++shift_reduce_conflict_count;

                      if (verbose)
                        qout() << "*** Warning. Found a shift/reduce conflict in state " << q << " on token ``" << s << "'' with rule " << r << Qt::endl;
                    }
                }
            }
        }
    }

  if (shift_reduce_conflict_count || reduce_reduce_conflict_count)
    {
      if (shift_reduce_conflict_count != grammar.expected_shift_reduce
          || reduce_reduce_conflict_count != grammar.expected_reduce_reduce)
        {
          qerr() << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl;
          if (warnings_are_errors)
            {
              qerr() << "qlalr: error: warning occurred, treating as error due to "
                        "--exit-on-warn." << Qt::endl;
              exit(2);
            }
        }

      if (verbose)
        qout() << Qt::endl << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl
             << Qt::endl;
    }

  QBitArray used_rules{static_cast<int>(grammar.rules.size())};

  int q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u < 0)
            used_rules.setBit (-u - 1);
        }
    }

  auto rule = grammar.rules.begin();
  for (int i = 0; i < used_rules.size(); ++i, ++rule)
    {
      if (! used_rules.testBit (i))
        {
          if (rule != grammar.goal)
            {
              qerr() << "*** Warning: Rule ``" << *rule << "'' is useless!" << Qt::endl;
              if (warnings_are_errors)
                {
                  qerr() << "qlalr: error: warning occurred, treating as error due to "
                            "--exit-on-warn." << Qt::endl;
                  exit(2);
                }
            }
        }
    }

  q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u >= 0)
            continue;

          RulePointer rule = std::next(grammar.rules.begin(), - u - 1);

          if (state->defaultReduce == rule)
            u = 0;
        }
    }

  // ... compress the goto table
  defgoto.resize (non_terminal_count);
  for (int j = 0; j < non_terminal_count; ++j)
    {
      count.fill (0, state_count);

      int &mx = defgoto [j];

      for (int i = 0; i < state_count; ++i)
        {
          int r = GOTO (i, j);

          if (! r)
            continue;

          ++count [r];

          if (count [r] > count [mx])
            mx = r;
        }
    }

  for (int i = 0; i < state_count; ++i)
    {
      for (int j = 0; j < non_terminal_count; ++j)
        {
          int &r = GOTO (i, j);

          if (r == defgoto [j])
            r = 0;
        }
    }

  compressed_action (table, state_count, terminal_count);
  compressed_goto (pgoto, state_count, non_terminal_count);

  delete[] table;
  table = nullptr;

  delete[] pgoto;
  pgoto = nullptr;

#undef ACTION
#undef GOTO

  if (! grammar.merged_output.isEmpty())
    {
      QFile f(grammar.merged_output);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s\n", qPrintable(grammar.merged_output));
          return;
        }

      QTextStream out (&f);

      // copyright headers must come first, otherwise the headers tests will fail
      if (copyright)
        {
          out << copyrightHeader()
              << privateCopyrightHeader()
              << Qt::endl;
        }

      out << "// This file was generated by qlalr - DO NOT EDIT!\n";

      out << startIncludeGuard(grammar.merged_output) << Qt::endl;

      if (copyright) {
          out << "#if defined(ERROR)" << Qt::endl
              << "#  undef ERROR" << Qt::endl
              << "#endif" << Qt::endl << Qt::endl;
      }

      generateDecl (out);
      generateImpl (out);
      out << p.decls();
      out << p.impls();
      out << Qt::endl;

      out << endIncludeGuard(grammar.merged_output) << Qt::endl;

      return;
    }

  // default behaviour
  QString declFileName = grammar.table_name.toLower () + "_p.h"_L1;
  QString bitsFileName = grammar.table_name.toLower () + ".cpp"_L1;

  { // decls...
    QFile f (declFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(declFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    QString prot = declFileName.toUpper ().replace (QLatin1Char ('.'), QLatin1Char ('_'));

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      {
        out << copyrightHeader()
            << privateCopyrightHeader()
            << Qt::endl;
      }

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#ifndef " << prot << Qt::endl
        << "#define " << prot << Qt::endl
        << Qt::endl;

    if (copyright) {
        out << "#include <QtCore/qglobal.h>" << Qt::endl << Qt::endl;
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    }
    generateDecl (out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

    out << "#endif // " << prot << Qt::endl << Qt::endl;
  } // end decls

  { // bits...
    QFile f (bitsFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(bitsFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      out << copyrightHeader();

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#include \"" << declFileName << "\"" << Qt::endl << Qt::endl;
    if (copyright)
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    generateImpl(out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

  } // end bits

  if (! grammar.decl_file_name.isEmpty ())
    {
      QFile f (grammar.decl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.decl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.decls();
    }

  if (! grammar.impl_file_name.isEmpty ())
    {
      QFile f (grammar.impl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.impl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.impls();
    }
}